

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O0

int decompress_smooth_data(j_decompress_ptr cinfo,JSAMPIMAGE output_buf)

{
  int iVar1;
  long lVar2;
  short *psVar3;
  ushort *puVar4;
  code *pcVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  byte bVar15;
  long in_RSI;
  long in_RDI;
  bool bVar16;
  JDIMENSION delta;
  int pred;
  int Al;
  int DC25;
  int DC24;
  int DC23;
  int DC22;
  int DC21;
  int DC20;
  int DC19;
  int DC18;
  int DC17;
  int DC16;
  int DC15;
  int DC14;
  int DC13;
  int DC12;
  int DC11;
  int DC10;
  int DC09;
  int DC08;
  int DC07;
  int DC06;
  int DC05;
  int DC04;
  int DC03;
  int DC02;
  int DC01;
  JLONG num;
  JLONG Q30;
  JLONG Q21;
  JLONG Q20;
  JLONG Q12;
  JLONG Q11;
  JLONG Q10;
  JLONG Q03;
  JLONG Q02;
  JLONG Q01;
  JLONG Q00;
  JQUANT_TBL *quanttbl;
  int *coef_bits;
  JCOEF *workspace;
  boolean change_dc;
  inverse_DCT_method_ptr inverse_DCT;
  jpeg_component_info *compptr;
  JDIMENSION output_col;
  JSAMPARRAY output_ptr;
  JBLOCKROW next_next_block_row;
  JBLOCKROW next_block_row;
  JBLOCKROW prev_block_row;
  JBLOCKROW prev_prev_block_row;
  JBLOCKROW buffer_ptr;
  JBLOCKARRAY buffer;
  int access_rows;
  int block_rows;
  int block_row;
  int ci;
  JDIMENSION last_block_column;
  JDIMENSION block_num;
  JDIMENSION last_iMCU_row;
  my_coef_ptr_conflict1 coef;
  JBLOCKROW in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  int local_1bc;
  int local_1ac;
  int local_19c;
  int local_18c;
  int local_174;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  ulong local_100;
  ulong local_f8;
  ulong local_e8;
  ulong local_d0;
  long local_a8;
  long local_88;
  long local_78;
  short *local_70;
  short *local_68;
  short *local_60;
  short *local_58;
  short *local_50;
  long local_48;
  uint local_3c;
  uint local_38;
  int local_34;
  int local_30;
  uint local_28;
  
  lVar2 = *(long *)(in_RDI + 0x230);
  iVar1 = *(int *)(in_RDI + 0x1a4);
  local_d0 = 0;
  local_e8 = 0;
  local_f8 = 0;
  local_100 = 0;
  psVar3 = *(short **)(lVar2 + 0x88);
  while( true ) {
    bVar16 = false;
    if (*(int *)(in_RDI + 0xac) <= *(int *)(in_RDI + 0xb4)) {
      bVar16 = *(int *)(*(long *)(in_RDI + 0x240) + 0x24) == 0;
    }
    if (!bVar16) break;
    if (*(int *)(in_RDI + 0xac) == *(int *)(in_RDI + 0xb4)) {
      iVar6 = 0;
      if (*(int *)(in_RDI + 0x20c) == 0) {
        iVar6 = 2;
      }
      if ((uint)(*(int *)(in_RDI + 0xb8) + iVar6) < *(uint *)(in_RDI + 0xb0)) break;
    }
    iVar6 = (*(code *)**(undefined8 **)(in_RDI + 0x240))(in_RDI);
    if (iVar6 == 0) {
      return 0;
    }
  }
  local_30 = 0;
  local_88 = *(long *)(in_RDI + 0x130);
  for (; local_30 < *(int *)(in_RDI + 0x38); local_30 = local_30 + 1) {
    if (*(int *)(local_88 + 0x30) != 0) {
      if (*(uint *)(in_RDI + 0xb8) < iVar1 - 2U) {
        local_38 = *(uint *)(local_88 + 0xc);
        local_3c = local_38 * 3;
      }
      else if (*(uint *)(in_RDI + 0xb8) < iVar1 - 1U) {
        local_38 = *(uint *)(local_88 + 0xc);
        local_3c = local_38 << 1;
      }
      else {
        local_38 = *(uint *)(local_88 + 0x20) % *(uint *)(local_88 + 0xc);
        if (local_38 == 0) {
          local_38 = *(uint *)(local_88 + 0xc);
        }
        local_3c = local_38;
      }
      if (*(uint *)(in_RDI + 0xb8) < 2) {
        if (*(int *)(in_RDI + 0xb8) == 0) {
          local_48 = (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                               (in_RDI,*(undefined8 *)(lVar2 + 0x90 + (long)local_30 * 8),0,local_3c
                               );
        }
        else {
          local_48 = (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                               (in_RDI,*(undefined8 *)(lVar2 + 0x90 + (long)local_30 * 8),
                                (*(int *)(in_RDI + 0xb8) + -1) * *(int *)(local_88 + 0xc),local_3c);
          local_48 = local_48 + (long)*(int *)(local_88 + 0xc) * 8;
        }
      }
      else {
        local_48 = (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                             (in_RDI,*(undefined8 *)(lVar2 + 0x90 + (long)local_30 * 8),
                              (*(int *)(in_RDI + 0xb8) + -2) * *(int *)(local_88 + 0xc),
                              *(int *)(local_88 + 0xc) * 2 + local_3c);
        local_48 = local_48 + (long)(*(int *)(local_88 + 0xc) << 1) * 8;
      }
      if (*(uint *)(*(long *)(in_RDI + 0x220) + 0x70) < *(uint *)(in_RDI + 0xb8)) {
        local_a8 = *(long *)(lVar2 + 0xe0) + (long)((local_30 + *(int *)(in_RDI + 0x38)) * 10) * 4;
      }
      else {
        local_a8 = *(long *)(lVar2 + 0xe0) + (long)(local_30 * 10) * 4;
      }
      bVar16 = false;
      if (((((*(int *)(local_a8 + 4) == -1) && (bVar16 = false, *(int *)(local_a8 + 8) == -1)) &&
           (bVar16 = false, *(int *)(local_a8 + 0xc) == -1)) &&
          ((bVar16 = false, *(int *)(local_a8 + 0x10) == -1 &&
           (bVar16 = false, *(int *)(local_a8 + 0x14) == -1)))) &&
         ((bVar16 = false, *(int *)(local_a8 + 0x18) == -1 &&
          ((bVar16 = false, *(int *)(local_a8 + 0x1c) == -1 &&
           (bVar16 = false, *(int *)(local_a8 + 0x20) == -1)))))) {
        bVar16 = *(int *)(local_a8 + 0x24) == -1;
      }
      puVar4 = *(ushort **)(local_88 + 0x50);
      uVar8 = (ulong)*puVar4;
      uVar9 = (ulong)puVar4[1];
      uVar10 = (ulong)puVar4[8];
      uVar11 = (ulong)puVar4[0x10];
      uVar12 = (ulong)puVar4[9];
      uVar13 = (ulong)puVar4[2];
      if (bVar16) {
        local_d0 = (ulong)puVar4[3];
        local_e8 = (ulong)puVar4[10];
        local_f8 = (ulong)puVar4[0x11];
        local_100 = (ulong)puVar4[0x18];
      }
      pcVar5 = *(code **)(*(long *)(in_RDI + 600) + 8 + (long)local_30 * 8);
      local_78 = *(long *)(in_RSI + (long)local_30 * 8);
      for (local_34 = 0; local_34 < (int)local_38; local_34 = local_34 + 1) {
        local_50 = (short *)(*(long *)(local_48 + (long)local_34 * 8) +
                            (ulong)*(uint *)(*(long *)(in_RDI + 0x220) + 0x1c + (long)local_30 * 4)
                            * 0x80);
        if ((0 < local_34) || (local_60 = local_50, *(int *)(in_RDI + 0xb8) != 0)) {
          local_60 = (short *)(*(long *)(local_48 + (long)(local_34 + -1) * 8) +
                              (ulong)*(uint *)(*(long *)(in_RDI + 0x220) + 0x1c + (long)local_30 * 4
                                              ) * 0x80);
        }
        if ((local_34 < 2) && (*(uint *)(in_RDI + 0xb8) < 2)) {
          local_58 = local_60;
        }
        else {
          local_58 = (short *)(*(long *)(local_48 + (long)(local_34 + -2) * 8) +
                              (ulong)*(uint *)(*(long *)(in_RDI + 0x220) + 0x1c + (long)local_30 * 4
                                              ) * 0x80);
        }
        if ((local_34 < (int)(local_38 - 1)) ||
           (local_68 = local_50, *(uint *)(in_RDI + 0xb8) < iVar1 - 1U)) {
          local_68 = (short *)(*(long *)(local_48 + (long)(local_34 + 1) * 8) +
                              (ulong)*(uint *)(*(long *)(in_RDI + 0x220) + 0x1c + (long)local_30 * 4
                                              ) * 0x80);
        }
        if ((local_34 < (int)(local_38 - 2)) || (*(uint *)(in_RDI + 0xb8) < iVar1 - 2U)) {
          local_70 = (short *)(*(long *)(local_48 + (long)(local_34 + 2) * 8) +
                              (ulong)*(uint *)(*(long *)(in_RDI + 0x220) + 0x1c + (long)local_30 * 4
                                              ) * 0x80);
        }
        else {
          local_70 = local_68;
        }
        local_118 = (int)*local_58;
        local_12c = (int)*local_60;
        local_140 = (int)*local_50;
        local_154 = (int)*local_68;
        local_168 = (int)*local_70;
        uVar7 = *(int *)(local_88 + 0x1c) - 1;
        local_164 = local_168;
        local_160 = local_168;
        local_15c = local_168;
        local_150 = local_154;
        local_14c = local_154;
        local_148 = local_154;
        local_13c = local_140;
        local_138 = local_140;
        local_134 = local_140;
        local_128 = local_12c;
        local_124 = local_12c;
        local_120 = local_12c;
        local_114 = local_118;
        local_110 = local_118;
        local_10c = local_118;
        for (local_28 = *(uint *)(*(long *)(in_RDI + 0x220) + 0x1c + (long)local_30 * 4);
            local_11c = local_118, local_130 = local_12c, local_144 = local_140,
            local_158 = local_154, local_16c = local_168,
            local_28 <= *(uint *)(*(long *)(in_RDI + 0x220) + 0x44 + (long)local_30 * 4);
            local_28 = local_28 + 1) {
          jcopy_block_row((JBLOCKROW)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                          in_stack_fffffffffffffe28,0);
          if ((local_28 == *(uint *)(*(long *)(in_RDI + 0x220) + 0x1c + (long)local_30 * 4)) &&
             (local_28 < uVar7)) {
            local_118 = (int)local_58[0x40];
            local_12c = (int)local_60[0x40];
            local_140 = (int)local_50[0x40];
            local_154 = (int)local_68[0x40];
            local_168 = (int)local_70[0x40];
          }
          if (local_28 + 1 < uVar7) {
            local_11c = (int)local_58[0x80];
            local_130 = (int)local_60[0x80];
            local_144 = (int)local_50[0x80];
            local_158 = (int)local_68[0x80];
            local_16c = (int)local_70[0x80];
          }
          iVar6 = *(int *)(local_a8 + 4);
          if ((iVar6 != 0) && (psVar3[1] == 0)) {
            if (bVar16) {
              local_18c = ((((-local_110 - local_10c) + local_118 + local_11c + local_120 * -3 +
                             local_124 * 0xd + local_12c * -0xd + local_130 * 3 + local_134 * -3 +
                             local_138 * 0x26 + local_140 * -0x26 + local_144 * 3 + local_148 * -3 +
                             local_14c * 0xd + local_154 * -0xd + local_158 * 3) - local_15c) -
                          local_160) + local_168 + local_16c;
            }
            else {
              local_18c = local_134 * -7 + local_138 * 0x32 + local_140 * -0x32 + local_144 * 7;
            }
            lVar14 = uVar8 * (long)local_18c;
            bVar15 = (byte)iVar6;
            if (lVar14 < 0) {
              local_174 = (int)((long)(uVar9 * 0x80 - lVar14) / (long)(uVar9 << 8));
              if ((0 < iVar6) && (1 << (bVar15 & 0x1f) <= local_174)) {
                local_174 = (1 << (bVar15 & 0x1f)) + -1;
              }
              local_174._0_2_ = -(short)local_174;
            }
            else {
              local_174 = (int)((long)(uVar9 * 0x80 + lVar14) / (long)(uVar9 << 8));
              if ((0 < iVar6) && (1 << (bVar15 & 0x1f) <= local_174)) {
                local_174 = (1 << (bVar15 & 0x1f)) + -1;
              }
            }
            psVar3[1] = (short)local_174;
          }
          iVar6 = *(int *)(local_a8 + 8);
          if ((iVar6 != 0) && (psVar3[8] == 0)) {
            if (bVar16) {
              local_19c = ((((((local_110 * -3 - local_10c) + local_114 * -3 + local_118 * -3) -
                             local_11c) - local_120) + local_124 * 0xd + local_128 * 0x26 +
                           local_12c * 0xd) - local_130) + local_148 + local_14c * -0xd +
                          local_150 * -0x26 + local_154 * -0xd + local_158 + local_15c +
                          local_160 * 3 + local_164 * 3 + local_168 * 3 + local_16c;
            }
            else {
              local_19c = local_114 * -7 + local_128 * 0x32 + local_150 * -0x32 + local_164 * 7;
            }
            lVar14 = uVar8 * (long)local_19c;
            bVar15 = (byte)iVar6;
            if (lVar14 < 0) {
              local_174 = (int)((long)(uVar10 * 0x80 - lVar14) / (long)(uVar10 << 8));
              if ((0 < iVar6) && (1 << (bVar15 & 0x1f) <= local_174)) {
                local_174 = (1 << (bVar15 & 0x1f)) + -1;
              }
              local_174._0_2_ = -(short)local_174;
            }
            else {
              local_174 = (int)((long)(uVar10 * 0x80 + lVar14) / (long)(uVar10 << 8));
              if ((0 < iVar6) && (1 << (bVar15 & 0x1f) <= local_174)) {
                local_174 = (1 << (bVar15 & 0x1f)) + -1;
              }
            }
            psVar3[8] = (short)local_174;
          }
          iVar6 = *(int *)(local_a8 + 0xc);
          if ((iVar6 != 0) && (psVar3[0x10] == 0)) {
            if (bVar16) {
              local_1ac = local_114 + local_124 * 2 + local_128 * 7 + local_12c * 2 + local_138 * -5
                          + local_13c * -0xe + local_140 * -5 + local_14c * 2 + local_150 * 7 +
                          local_154 * 2 + local_164;
            }
            else {
              local_1ac = ((local_128 * 0xd - local_114) + local_13c * -0x18 + local_150 * 0xd) -
                          local_164;
            }
            lVar14 = uVar8 * (long)local_1ac;
            bVar15 = (byte)iVar6;
            if (lVar14 < 0) {
              local_174 = (int)((long)(uVar11 * 0x80 - lVar14) / (long)(uVar11 << 8));
              if ((0 < iVar6) && (1 << (bVar15 & 0x1f) <= local_174)) {
                local_174 = (1 << (bVar15 & 0x1f)) + -1;
              }
              local_174._0_2_ = -(short)local_174;
            }
            else {
              local_174 = (int)((long)(uVar11 * 0x80 + lVar14) / (long)(uVar11 << 8));
              if ((0 < iVar6) && (1 << (bVar15 & 0x1f) <= local_174)) {
                local_174 = (1 << (bVar15 & 0x1f)) + -1;
              }
            }
            psVar3[0x10] = (short)local_174;
          }
          iVar6 = *(int *)(local_a8 + 0x10);
          if ((iVar6 != 0) && (psVar3[9] == 0)) {
            if (bVar16) {
              local_1bc = ((local_11c - local_10c) + local_124 * 9 + local_12c * -9 + local_14c * -9
                           + local_154 * 9 + local_15c) - local_16c;
            }
            else {
              local_1bc = (((((((local_130 + local_148 + local_14c * -10 + local_154 * 10) -
                               local_110) - local_158) + local_160) - local_168) + local_118) -
                          local_120) + local_124 * 10 + local_12c * -10;
            }
            lVar14 = uVar8 * (long)local_1bc;
            bVar15 = (byte)iVar6;
            if (lVar14 < 0) {
              local_174 = (int)((long)(uVar12 * 0x80 - lVar14) / (long)(uVar12 << 8));
              if ((0 < iVar6) && (1 << (bVar15 & 0x1f) <= local_174)) {
                local_174 = (1 << (bVar15 & 0x1f)) + -1;
              }
              local_174._0_2_ = -(short)local_174;
            }
            else {
              local_174 = (int)((long)(uVar12 * 0x80 + lVar14) / (long)(uVar12 << 8));
              if ((0 < iVar6) && (1 << (bVar15 & 0x1f) <= local_174)) {
                local_174 = (1 << (bVar15 & 0x1f)) + -1;
              }
            }
            psVar3[9] = (short)local_174;
          }
          iVar6 = *(int *)(local_a8 + 0x14);
          if ((iVar6 != 0) && (psVar3[2] == 0)) {
            if (bVar16) {
              in_stack_fffffffffffffe34 =
                   local_124 * 2 + local_128 * -5 + local_12c * 2 + local_134 + local_138 * 7 +
                   local_13c * -0xe + local_140 * 7 + local_144 + local_14c * 2 + local_150 * -5 +
                   local_154 * 2;
            }
            else {
              in_stack_fffffffffffffe34 =
                   ((local_138 * 0xd - local_134) + local_13c * -0x18 + local_140 * 0xd) - local_144
              ;
            }
            lVar14 = uVar8 * (long)in_stack_fffffffffffffe34;
            bVar15 = (byte)iVar6;
            if (lVar14 < 0) {
              local_174 = (int)((long)(uVar13 * 0x80 - lVar14) / (long)(uVar13 << 8));
              if ((0 < iVar6) && (1 << (bVar15 & 0x1f) <= local_174)) {
                local_174 = (1 << (bVar15 & 0x1f)) + -1;
              }
              local_174._0_2_ = -(short)local_174;
            }
            else {
              local_174 = (int)((long)(uVar13 * 0x80 + lVar14) / (long)(uVar13 << 8));
              if ((0 < iVar6) && (1 << (bVar15 & 0x1f) <= local_174)) {
                local_174 = (1 << (bVar15 & 0x1f)) + -1;
              }
            }
            psVar3[2] = (short)local_174;
          }
          if (bVar16) {
            iVar6 = *(int *)(local_a8 + 0x18);
            if ((iVar6 != 0) && (psVar3[3] == 0)) {
              lVar14 = uVar8 * (long)(((local_124 - local_12c) + local_138 * 2 + local_140 * -2 +
                                      local_14c) - local_154);
              bVar15 = (byte)iVar6;
              if (lVar14 < 0) {
                local_174 = (int)((long)(local_d0 * 0x80 - lVar14) / (long)(local_d0 << 8));
                if ((0 < iVar6) && (1 << (bVar15 & 0x1f) <= local_174)) {
                  local_174 = (1 << (bVar15 & 0x1f)) + -1;
                }
                local_174._0_2_ = -(short)local_174;
              }
              else {
                local_174 = (int)((long)(local_d0 * 0x80 + lVar14) / (long)(local_d0 << 8));
                if ((0 < iVar6) && (1 << (bVar15 & 0x1f) <= local_174)) {
                  local_174 = (1 << (bVar15 & 0x1f)) + -1;
                }
              }
              psVar3[3] = (short)local_174;
            }
            iVar6 = *(int *)(local_a8 + 0x1c);
            if ((iVar6 != 0) && (psVar3[10] == 0)) {
              lVar14 = uVar8 * (long)((((local_124 + local_128 * -3 + local_12c) - local_14c) +
                                      local_150 * 3) - local_154);
              bVar15 = (byte)iVar6;
              if (lVar14 < 0) {
                local_174 = (int)((long)(local_e8 * 0x80 - lVar14) / (long)(local_e8 << 8));
                if ((0 < iVar6) && (1 << (bVar15 & 0x1f) <= local_174)) {
                  local_174 = (1 << (bVar15 & 0x1f)) + -1;
                }
                local_174._0_2_ = -(short)local_174;
              }
              else {
                local_174 = (int)((long)(local_e8 * 0x80 + lVar14) / (long)(local_e8 << 8));
                if ((0 < iVar6) && (1 << (bVar15 & 0x1f) <= local_174)) {
                  local_174 = (1 << (bVar15 & 0x1f)) + -1;
                }
              }
              psVar3[10] = (short)local_174;
            }
            iVar6 = *(int *)(local_a8 + 0x20);
            if ((iVar6 != 0) && (psVar3[0x11] == 0)) {
              lVar14 = uVar8 * (long)(((local_124 - local_12c) + local_138 * -3 + local_140 * 3 +
                                      local_14c) - local_154);
              bVar15 = (byte)iVar6;
              if (lVar14 < 0) {
                local_174 = (int)((long)(local_f8 * 0x80 - lVar14) / (long)(local_f8 << 8));
                if ((0 < iVar6) && (1 << (bVar15 & 0x1f) <= local_174)) {
                  local_174 = (1 << (bVar15 & 0x1f)) + -1;
                }
                local_174._0_2_ = -(short)local_174;
              }
              else {
                local_174 = (int)((long)(local_f8 * 0x80 + lVar14) / (long)(local_f8 << 8));
                if ((0 < iVar6) && (1 << (bVar15 & 0x1f) <= local_174)) {
                  local_174 = (1 << (bVar15 & 0x1f)) + -1;
                }
              }
              psVar3[0x11] = (short)local_174;
            }
            iVar6 = *(int *)(local_a8 + 0x24);
            if ((iVar6 != 0) && (psVar3[0x18] == 0)) {
              lVar14 = uVar8 * (long)((((local_124 + local_128 * 2 + local_12c) - local_14c) +
                                      local_150 * -2) - local_154);
              bVar15 = (byte)iVar6;
              if (lVar14 < 0) {
                local_174 = (int)((long)(local_100 * 0x80 - lVar14) / (long)(local_100 << 8));
                if ((0 < iVar6) && (1 << (bVar15 & 0x1f) <= local_174)) {
                  local_174 = (1 << (bVar15 & 0x1f)) + -1;
                }
                local_174._0_2_ = -(short)local_174;
              }
              else {
                local_174 = (int)((long)(local_100 * 0x80 + lVar14) / (long)(local_100 << 8));
                if ((0 < iVar6) && (1 << (bVar15 & 0x1f) <= local_174)) {
                  local_174 = (1 << (bVar15 & 0x1f)) + -1;
                }
              }
              psVar3[0x18] = (short)local_174;
            }
            lVar14 = uVar8 * (long)(local_10c * -2 + local_110 * -6 + local_114 * -8 +
                                    local_118 * -6 + local_11c * -2 + local_120 * -6 + local_124 * 6
                                    + local_128 * 0x2a + local_12c * 6 + local_130 * -6 +
                                    local_134 * -8 + local_138 * 0x2a + local_13c * 0x98 +
                                    local_140 * 0x2a + local_144 * -8 + local_148 * -6 +
                                    local_14c * 6 + local_150 * 0x2a + local_154 * 6 +
                                    local_158 * -6 + local_15c * -2 + local_160 * -6 +
                                    local_164 * -8 + local_168 * -6 + local_16c * -2);
            if (lVar14 < 0) {
              local_174._0_2_ = -(short)((long)(uVar8 * 0x80 - lVar14) / (long)(uVar8 << 8));
            }
            else {
              local_174._0_2_ = (short)((long)(uVar8 * 0x80 + lVar14) / (long)(uVar8 << 8));
            }
            *psVar3 = (short)local_174;
          }
          (*pcVar5)(in_RDI,local_88,psVar3,local_78);
          local_10c = local_110;
          local_110 = local_114;
          local_114 = local_118;
          local_118 = local_11c;
          local_120 = local_124;
          local_124 = local_128;
          local_128 = local_12c;
          local_12c = local_130;
          local_134 = local_138;
          local_138 = local_13c;
          local_13c = local_140;
          local_140 = local_144;
          local_148 = local_14c;
          local_14c = local_150;
          local_150 = local_154;
          local_154 = local_158;
          local_15c = local_160;
          local_160 = local_164;
          local_164 = local_168;
          local_168 = local_16c;
          local_50 = local_50 + 0x40;
          local_60 = local_60 + 0x40;
          local_68 = local_68 + 0x40;
          local_58 = local_58 + 0x40;
          local_70 = local_70 + 0x40;
        }
        local_78 = local_78 + (long)*(int *)(local_88 + 0x24) * 8;
      }
    }
    local_88 = local_88 + 0x60;
  }
  uVar7 = *(int *)(in_RDI + 0xb8) + 1;
  *(uint *)(in_RDI + 0xb8) = uVar7;
  if (uVar7 < *(uint *)(in_RDI + 0x1a4)) {
    return 3;
  }
  return 4;
}

Assistant:

METHODDEF(int)
decompress_smooth_data(j_decompress_ptr cinfo, JSAMPIMAGE output_buf)
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  JDIMENSION block_num, last_block_column;
  int ci, block_row, block_rows, access_rows;
  JBLOCKARRAY buffer;
  JBLOCKROW buffer_ptr, prev_prev_block_row, prev_block_row;
  JBLOCKROW next_block_row, next_next_block_row;
  JSAMPARRAY output_ptr;
  JDIMENSION output_col;
  jpeg_component_info *compptr;
  inverse_DCT_method_ptr inverse_DCT;
  boolean change_dc;
  JCOEF *workspace;
  int *coef_bits;
  JQUANT_TBL *quanttbl;
  JLONG Q00, Q01, Q02, Q03 = 0, Q10, Q11, Q12 = 0, Q20, Q21 = 0, Q30 = 0, num;
  int DC01, DC02, DC03, DC04, DC05, DC06, DC07, DC08, DC09, DC10, DC11, DC12,
      DC13, DC14, DC15, DC16, DC17, DC18, DC19, DC20, DC21, DC22, DC23, DC24,
      DC25;
  int Al, pred;

  /* Keep a local variable to avoid looking it up more than once */
  workspace = coef->workspace;

  /* Force some input to be done if we are getting ahead of the input. */
  while (cinfo->input_scan_number <= cinfo->output_scan_number &&
         !cinfo->inputctl->eoi_reached) {
    if (cinfo->input_scan_number == cinfo->output_scan_number) {
      /* If input is working on current scan, we ordinarily want it to
       * have completed the current row.  But if input scan is DC,
       * we want it to keep two rows ahead so that next two block rows' DC
       * values are up to date.
       */
      JDIMENSION delta = (cinfo->Ss == 0) ? 2 : 0;
      if (cinfo->input_iMCU_row > cinfo->output_iMCU_row + delta)
        break;
    }
    if ((*cinfo->inputctl->consume_input) (cinfo) == JPEG_SUSPENDED)
      return JPEG_SUSPENDED;
  }

  /* OK, output from the virtual arrays. */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Don't bother to IDCT an uninteresting component. */
    if (!compptr->component_needed)
      continue;
    /* Count non-dummy DCT block rows in this iMCU row. */
    if (cinfo->output_iMCU_row < last_iMCU_row - 1) {
      block_rows = compptr->v_samp_factor;
      access_rows = block_rows * 3; /* this and next two iMCU rows */
    } else if (cinfo->output_iMCU_row < last_iMCU_row) {
      block_rows = compptr->v_samp_factor;
      access_rows = block_rows * 2; /* this and next iMCU row */
    } else {
      /* NB: can't use last_row_height here; it is input-side-dependent! */
      block_rows = (int)(compptr->height_in_blocks % compptr->v_samp_factor);
      if (block_rows == 0) block_rows = compptr->v_samp_factor;
      access_rows = block_rows; /* this iMCU row only */
    }
    /* Align the virtual buffer for this component. */
    if (cinfo->output_iMCU_row > 1) {
      access_rows += 2 * compptr->v_samp_factor; /* prior two iMCU rows too */
      buffer = (*cinfo->mem->access_virt_barray)
        ((j_common_ptr)cinfo, coef->whole_image[ci],
         (cinfo->output_iMCU_row - 2) * compptr->v_samp_factor,
         (JDIMENSION)access_rows, FALSE);
      buffer += 2 * compptr->v_samp_factor; /* point to current iMCU row */
    } else if (cinfo->output_iMCU_row > 0) {
      buffer = (*cinfo->mem->access_virt_barray)
        ((j_common_ptr)cinfo, coef->whole_image[ci],
         (cinfo->output_iMCU_row - 1) * compptr->v_samp_factor,
         (JDIMENSION)access_rows, FALSE);
      buffer += compptr->v_samp_factor; /* point to current iMCU row */
    } else {
      buffer = (*cinfo->mem->access_virt_barray)
        ((j_common_ptr)cinfo, coef->whole_image[ci],
         (JDIMENSION)0, (JDIMENSION)access_rows, FALSE);
    }
    /* Fetch component-dependent info.
     * If the current scan is incomplete, then we use the component-dependent
     * info from the previous scan.
     */
    if (cinfo->output_iMCU_row > cinfo->master->last_good_iMCU_row)
      coef_bits =
        coef->coef_bits_latch + ((ci + cinfo->num_components) * SAVED_COEFS);
    else
      coef_bits = coef->coef_bits_latch + (ci * SAVED_COEFS);

    /* We only do DC interpolation if no AC coefficient data is available. */
    change_dc =
      coef_bits[1] == -1 && coef_bits[2] == -1 && coef_bits[3] == -1 &&
      coef_bits[4] == -1 && coef_bits[5] == -1 && coef_bits[6] == -1 &&
      coef_bits[7] == -1 && coef_bits[8] == -1 && coef_bits[9] == -1;

    quanttbl = compptr->quant_table;
    Q00 = quanttbl->quantval[0];
    Q01 = quanttbl->quantval[Q01_POS];
    Q10 = quanttbl->quantval[Q10_POS];
    Q20 = quanttbl->quantval[Q20_POS];
    Q11 = quanttbl->quantval[Q11_POS];
    Q02 = quanttbl->quantval[Q02_POS];
    if (change_dc) {
      Q03 = quanttbl->quantval[Q03_POS];
      Q12 = quanttbl->quantval[Q12_POS];
      Q21 = quanttbl->quantval[Q21_POS];
      Q30 = quanttbl->quantval[Q30_POS];
    }
    inverse_DCT = cinfo->idct->inverse_DCT[ci];
    output_ptr = output_buf[ci];
    /* Loop over all DCT blocks to be processed. */
    for (block_row = 0; block_row < block_rows; block_row++) {
      buffer_ptr = buffer[block_row] + cinfo->master->first_MCU_col[ci];

      if (block_row > 0 || cinfo->output_iMCU_row > 0)
        prev_block_row =
          buffer[block_row - 1] + cinfo->master->first_MCU_col[ci];
      else
        prev_block_row = buffer_ptr;

      if (block_row > 1 || cinfo->output_iMCU_row > 1)
        prev_prev_block_row =
          buffer[block_row - 2] + cinfo->master->first_MCU_col[ci];
      else
        prev_prev_block_row = prev_block_row;

      if (block_row < block_rows - 1 || cinfo->output_iMCU_row < last_iMCU_row)
        next_block_row =
          buffer[block_row + 1] + cinfo->master->first_MCU_col[ci];
      else
        next_block_row = buffer_ptr;

      if (block_row < block_rows - 2 ||
          cinfo->output_iMCU_row < last_iMCU_row - 1)
        next_next_block_row =
          buffer[block_row + 2] + cinfo->master->first_MCU_col[ci];
      else
        next_next_block_row = next_block_row;

      /* We fetch the surrounding DC values using a sliding-register approach.
       * Initialize all 25 here so as to do the right thing on narrow pics.
       */
      DC01 = DC02 = DC03 = DC04 = DC05 = (int)prev_prev_block_row[0][0];
      DC06 = DC07 = DC08 = DC09 = DC10 = (int)prev_block_row[0][0];
      DC11 = DC12 = DC13 = DC14 = DC15 = (int)buffer_ptr[0][0];
      DC16 = DC17 = DC18 = DC19 = DC20 = (int)next_block_row[0][0];
      DC21 = DC22 = DC23 = DC24 = DC25 = (int)next_next_block_row[0][0];
      output_col = 0;
      last_block_column = compptr->width_in_blocks - 1;
      for (block_num = cinfo->master->first_MCU_col[ci];
           block_num <= cinfo->master->last_MCU_col[ci]; block_num++) {
        /* Fetch current DCT block into workspace so we can modify it. */
        jcopy_block_row(buffer_ptr, (JBLOCKROW)workspace, (JDIMENSION)1);
        /* Update DC values */
        if (block_num == cinfo->master->first_MCU_col[ci] &&
            block_num < last_block_column) {
          DC04 = (int)prev_prev_block_row[1][0];
          DC09 = (int)prev_block_row[1][0];
          DC14 = (int)buffer_ptr[1][0];
          DC19 = (int)next_block_row[1][0];
          DC24 = (int)next_next_block_row[1][0];
        }
        if (block_num + 1 < last_block_column) {
          DC05 = (int)prev_prev_block_row[2][0];
          DC10 = (int)prev_block_row[2][0];
          DC15 = (int)buffer_ptr[2][0];
          DC20 = (int)next_block_row[2][0];
          DC25 = (int)next_next_block_row[2][0];
        }
        /* If DC interpolation is enabled, compute coefficient estimates using
         * a Gaussian-like kernel, keeping the averages of the DC values.
         *
         * If DC interpolation is disabled, compute coefficient estimates using
         * an algorithm similar to the one described in Section K.8 of the JPEG
         * standard, except applied to a 5x5 window rather than a 3x3 window.
         *
         * An estimate is applied only if the coefficient is still zero and is
         * not known to be fully accurate.
         */
        /* AC01 */
        if ((Al = coef_bits[1]) != 0 && workspace[1] == 0) {
          num = Q00 * (change_dc ?
                (-DC01 - DC02 + DC04 + DC05 - 3 * DC06 + 13 * DC07 -
                 13 * DC09 + 3 * DC10 - 3 * DC11 + 38 * DC12 - 38 * DC14 +
                 3 * DC15 - 3 * DC16 + 13 * DC17 - 13 * DC19 + 3 * DC20 -
                 DC21 - DC22 + DC24 + DC25) :
                (-7 * DC11 + 50 * DC12 - 50 * DC14 + 7 * DC15));
          if (num >= 0) {
            pred = (int)(((Q01 << 7) + num) / (Q01 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
          } else {
            pred = (int)(((Q01 << 7) - num) / (Q01 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
            pred = -pred;
          }
          workspace[1] = (JCOEF)pred;
        }
        /* AC10 */
        if ((Al = coef_bits[2]) != 0 && workspace[8] == 0) {
          num = Q00 * (change_dc ?
                (-DC01 - 3 * DC02 - 3 * DC03 - 3 * DC04 - DC05 - DC06 +
                 13 * DC07 + 38 * DC08 + 13 * DC09 - DC10 + DC16 -
                 13 * DC17 - 38 * DC18 - 13 * DC19 + DC20 + DC21 +
                 3 * DC22 + 3 * DC23 + 3 * DC24 + DC25) :
                (-7 * DC03 + 50 * DC08 - 50 * DC18 + 7 * DC23));
          if (num >= 0) {
            pred = (int)(((Q10 << 7) + num) / (Q10 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
          } else {
            pred = (int)(((Q10 << 7) - num) / (Q10 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
            pred = -pred;
          }
          workspace[8] = (JCOEF)pred;
        }
        /* AC20 */
        if ((Al = coef_bits[3]) != 0 && workspace[16] == 0) {
          num = Q00 * (change_dc ?
                (DC03 + 2 * DC07 + 7 * DC08 + 2 * DC09 - 5 * DC12 - 14 * DC13 -
                 5 * DC14 + 2 * DC17 + 7 * DC18 + 2 * DC19 + DC23) :
                (-DC03 + 13 * DC08 - 24 * DC13 + 13 * DC18 - DC23));
          if (num >= 0) {
            pred = (int)(((Q20 << 7) + num) / (Q20 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
          } else {
            pred = (int)(((Q20 << 7) - num) / (Q20 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
            pred = -pred;
          }
          workspace[16] = (JCOEF)pred;
        }
        /* AC11 */
        if ((Al = coef_bits[4]) != 0 && workspace[9] == 0) {
          num = Q00 * (change_dc ?
                (-DC01 + DC05 + 9 * DC07 - 9 * DC09 - 9 * DC17 +
                 9 * DC19 + DC21 - DC25) :
                (DC10 + DC16 - 10 * DC17 + 10 * DC19 - DC02 - DC20 + DC22 -
                 DC24 + DC04 - DC06 + 10 * DC07 - 10 * DC09));
          if (num >= 0) {
            pred = (int)(((Q11 << 7) + num) / (Q11 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
          } else {
            pred = (int)(((Q11 << 7) - num) / (Q11 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
            pred = -pred;
          }
          workspace[9] = (JCOEF)pred;
        }
        /* AC02 */
        if ((Al = coef_bits[5]) != 0 && workspace[2] == 0) {
          num = Q00 * (change_dc ?
                (2 * DC07 - 5 * DC08 + 2 * DC09 + DC11 + 7 * DC12 - 14 * DC13 +
                 7 * DC14 + DC15 + 2 * DC17 - 5 * DC18 + 2 * DC19) :
                (-DC11 + 13 * DC12 - 24 * DC13 + 13 * DC14 - DC15));
          if (num >= 0) {
            pred = (int)(((Q02 << 7) + num) / (Q02 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
          } else {
            pred = (int)(((Q02 << 7) - num) / (Q02 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
            pred = -pred;
          }
          workspace[2] = (JCOEF)pred;
        }
        if (change_dc) {
          /* AC03 */
          if ((Al = coef_bits[6]) != 0 && workspace[3] == 0) {
            num = Q00 * (DC07 - DC09 + 2 * DC12 - 2 * DC14 + DC17 - DC19);
            if (num >= 0) {
              pred = (int)(((Q03 << 7) + num) / (Q03 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
            } else {
              pred = (int)(((Q03 << 7) - num) / (Q03 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
              pred = -pred;
            }
            workspace[3] = (JCOEF)pred;
          }
          /* AC12 */
          if ((Al = coef_bits[7]) != 0 && workspace[10] == 0) {
            num = Q00 * (DC07 - 3 * DC08 + DC09 - DC17 + 3 * DC18 - DC19);
            if (num >= 0) {
              pred = (int)(((Q12 << 7) + num) / (Q12 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
            } else {
              pred = (int)(((Q12 << 7) - num) / (Q12 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
              pred = -pred;
            }
            workspace[10] = (JCOEF)pred;
          }
          /* AC21 */
          if ((Al = coef_bits[8]) != 0 && workspace[17] == 0) {
            num = Q00 * (DC07 - DC09 - 3 * DC12 + 3 * DC14 + DC17 - DC19);
            if (num >= 0) {
              pred = (int)(((Q21 << 7) + num) / (Q21 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
            } else {
              pred = (int)(((Q21 << 7) - num) / (Q21 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
              pred = -pred;
            }
            workspace[17] = (JCOEF)pred;
          }
          /* AC30 */
          if ((Al = coef_bits[9]) != 0 && workspace[24] == 0) {
            num = Q00 * (DC07 + 2 * DC08 + DC09 - DC17 - 2 * DC18 - DC19);
            if (num >= 0) {
              pred = (int)(((Q30 << 7) + num) / (Q30 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
            } else {
              pred = (int)(((Q30 << 7) - num) / (Q30 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
              pred = -pred;
            }
            workspace[24] = (JCOEF)pred;
          }
          /* coef_bits[0] is non-negative.  Otherwise this function would not
           * be called.
           */
          num = Q00 *
                (-2 * DC01 - 6 * DC02 - 8 * DC03 - 6 * DC04 - 2 * DC05 -
                 6 * DC06 + 6 * DC07 + 42 * DC08 + 6 * DC09 - 6 * DC10 -
                 8 * DC11 + 42 * DC12 + 152 * DC13 + 42 * DC14 - 8 * DC15 -
                 6 * DC16 + 6 * DC17 + 42 * DC18 + 6 * DC19 - 6 * DC20 -
                 2 * DC21 - 6 * DC22 - 8 * DC23 - 6 * DC24 - 2 * DC25);
          if (num >= 0) {
            pred = (int)(((Q00 << 7) + num) / (Q00 << 8));
          } else {
            pred = (int)(((Q00 << 7) - num) / (Q00 << 8));
            pred = -pred;
          }
          workspace[0] = (JCOEF)pred;
        }  /* change_dc */

        /* OK, do the IDCT */
        (*inverse_DCT) (cinfo, compptr, (JCOEFPTR)workspace, output_ptr,
                        output_col);
        /* Advance for next column */
        DC01 = DC02;  DC02 = DC03;  DC03 = DC04;  DC04 = DC05;
        DC06 = DC07;  DC07 = DC08;  DC08 = DC09;  DC09 = DC10;
        DC11 = DC12;  DC12 = DC13;  DC13 = DC14;  DC14 = DC15;
        DC16 = DC17;  DC17 = DC18;  DC18 = DC19;  DC19 = DC20;
        DC21 = DC22;  DC22 = DC23;  DC23 = DC24;  DC24 = DC25;
        buffer_ptr++, prev_block_row++, next_block_row++,
          prev_prev_block_row++, next_next_block_row++;
        output_col += compptr->_DCT_scaled_size;
      }
      output_ptr += compptr->_DCT_scaled_size;
    }
  }

  if (++(cinfo->output_iMCU_row) < cinfo->total_iMCU_rows)
    return JPEG_ROW_COMPLETED;
  return JPEG_SCAN_COMPLETED;
}